

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O3

void addEdgesFromNotMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  int iVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Rb_tree_node_base *p_Var8;
  _Alloc_hider _Var9;
  bool bVar10;
  string def;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  CTemp defTemp;
  string local_170;
  CodeLine *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  string local_140;
  undefined1 *local_120;
  size_t local_118;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_e0;
  pointer local_d8;
  pointer local_d0;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_48;
  
  local_150 = line;
  local_e0 = graph;
  (*((line->command).super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_AssemblyCommand[1])(&local_48);
  local_d8 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar3 = &local_150->liveOutTemps;
    local_148 = ignoreList;
    do {
      local_68[0] = local_58;
      pcVar1 = ((local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                 super__Vector_impl_data._M_start)->name)._M_dataplus._M_p;
      local_d0 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                 super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,
                 pcVar1 + ((local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>.
                            _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length);
      for (p_Var8 = (local_150->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        local_120 = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        IRT::CTemp::ToString_abi_cxx11_(&local_170,(CTemp *)local_68);
        _Var9._M_p = local_170._M_dataplus._M_p;
        if (local_170._M_string_length == local_118) {
          if (local_170._M_string_length == 0) {
            bVar10 = false;
          }
          else {
            iVar5 = bcmp(local_170._M_dataplus._M_p,local_120,local_170._M_string_length);
            bVar10 = iVar5 != 0;
          }
        }
        else {
          bVar10 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_170.field_2) {
          operator_delete(_Var9._M_p);
        }
        if (bVar10) {
          IRT::CTemp::ToString_abi_cxx11_(&local_170,(CTemp *)local_68);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_120,local_120 + local_118);
          bVar10 = isInIgnoreList(&local_170);
          if ((!bVar10) && (bVar10 = isInIgnoreList(&local_140), !bVar10)) {
            local_100[0] = &local_f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_100,local_170._M_dataplus._M_p,
                       local_170._M_dataplus._M_p + local_170._M_string_length);
            pvVar4 = local_148;
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((local_148->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (local_148->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,local_100);
            if (_Var6._M_current ==
                (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_a8[0] = local_98;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_a8,local_140._M_dataplus._M_p,
                         local_140._M_dataplus._M_p + local_140._M_string_length);
              pvVar4 = local_148;
              _Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                ((local_148->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start,
                                 (local_148->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish,local_a8);
              pbVar2 = (pvVar4->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (local_a8[0] != local_98) {
                operator_delete(local_a8[0]);
              }
              if (local_100[0] != &local_f0) {
                operator_delete(local_100[0]);
              }
              if (_Var6._M_current != pbVar2) goto LAB_00154433;
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c8,local_170._M_dataplus._M_p,
                         local_170._M_dataplus._M_p + local_170._M_string_length);
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,local_140._M_dataplus._M_p,
                         local_140._M_dataplus._M_p + local_140._M_string_length);
              AssemblyCode::addNotOrientedEdge(&local_c8,&local_88,local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p);
              }
              paVar7 = &local_c8.field_2;
              _Var9._M_p = local_c8._M_dataplus._M_p;
            }
            else {
              paVar7 = &local_f0;
              _Var9._M_p = (pointer)local_100[0];
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != paVar7) {
              operator_delete(_Var9._M_p);
            }
          }
LAB_00154433:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
        if (local_120 != local_110) {
          operator_delete(local_120);
        }
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_start = local_d0 + 1;
    } while (local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_start != local_d8);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_48);
  return;
}

Assistant:

void addEdgesFromNotMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                             std::vector<std::string>& ignoreList) {
    for (auto defTemp : line.command->GetOut()) {
        for (auto outTemp : line.liveOutTemps) {
            if (defTemp.ToString() != outTemp) {
                std::string def = defTemp.ToString( );
                std::string out = outTemp;
                if ( !isInIgnoreList( def ) && !isInIgnoreList( out ) && !isInDynamicIgnoreList(def, ignoreList) && !isInDynamicIgnoreList(out, ignoreList)) {
                    AssemblyCode::addNotOrientedEdge( def, out, graph );
                }
            }
        }
    }
}